

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O0

void __thiscall despot::LaserTag::LaserTag(LaserTag *this)

{
  string local_1b0;
  istringstream local_190 [8];
  istringstream iss;
  LaserTag *this_local;
  
  BaseTag::BaseTag(&this->super_BaseTag);
  *(undefined ***)&this->super_BaseTag = &PTR__LaserTag_001599e8;
  *(undefined ***)&(this->super_BaseTag).super_BeliefMDP = &PTR__LaserTag_00159b18;
  *(undefined ***)&(this->super_BaseTag).super_StateIndexer = &PTR__LaserTag_00159c20;
  *(undefined ***)&(this->super_BaseTag).super_StatePolicy = &PTR__LaserTag_00159c58;
  *(undefined ***)&(this->super_BaseTag).super_MMAPInferencer = &PTR__LaserTag_00159c80;
  this->noise_sigma_ = 2.5;
  this->unit_size_ = 1.0;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&this->reading_distributions_);
  BaseTag::RandomMap_abi_cxx11_(&local_1b0,&this->super_BaseTag,7,0xb,8);
  std::__cxx11::istringstream::istringstream(local_190,(string *)&local_1b0,_S_in);
  std::__cxx11::string::~string((string *)&local_1b0);
  BaseTag::Init(&this->super_BaseTag,(istream *)local_190);
  Init(this);
  (this->super_BaseTag).robot_pos_unknown_ = false;
  std::__cxx11::istringstream::~istringstream(local_190);
  return;
}

Assistant:

LaserTag::LaserTag() :
	BaseTag(),
	noise_sigma_(2.5),
	unit_size_(1.0) {
	istringstream iss(RandomMap(7, 11, 8));
	BaseTag::Init(iss);
	Init();
  robot_pos_unknown_ = false;
}